

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PackedUnionType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PackedUnionType,slang::ast::Compilation&,bool_const&,bool_const&,bool_const&,slang::SourceLocation,slang::ast::ASTContext_const&>
          (BumpAllocator *this,Compilation *args,bool *args_1,bool *args_2,bool *args_3,
          SourceLocation *args_4,ASTContext *args_5)

{
  PackedUnionType *pPVar1;
  undefined8 in_RDX;
  Compilation *in_RSI;
  PackedUnionType *in_RDI;
  BumpAllocator *in_R8;
  size_t in_R9;
  SourceLocation unaff_retaddr;
  ASTContext *in_stack_00000010;
  size_t in_stack_ffffffffffffffc8;
  
  pPVar1 = (PackedUnionType *)allocate(in_R8,in_R9,in_stack_ffffffffffffffc8);
  ast::PackedUnionType::PackedUnionType
            (in_RDI,in_RSI,SUB81((ulong)in_RDX >> 0x38,0),SUB81((ulong)in_RDX >> 0x30,0),
             SUB81((ulong)in_RDX >> 0x28,0),unaff_retaddr,in_stack_00000010);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }